

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

void __thiscall
mjs::interpreter::impl::auto_scope::auto_scope
          (auto_scope *this,impl *parent,object_ptr *act,scope_ptr *prev)

{
  this->parent = parent;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped
            (&(this->old_scopes).super_gc_heap_ptr_untyped,
             &(parent->active_scope_).super_gc_heap_ptr_untyped);
  gc_heap::
  make<mjs::interpreter::impl::scope,mjs::gc_heap_ptr<mjs::object>const&,mjs::gc_heap_ptr<mjs::interpreter::impl::scope>const&>
            ((gc_heap *)&stack0xffffffffffffffd0,
             (gc_heap_ptr<mjs::object> *)(act->super_gc_heap_ptr_untyped).heap_,
             (gc_heap_ptr<mjs::interpreter::impl::scope> *)act);
  gc_heap_ptr_untyped::operator=
            (&(parent->active_scope_).super_gc_heap_ptr_untyped,
             (gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

explicit auto_scope(impl& parent, const object_ptr& act, const scope_ptr& prev) : parent(parent), old_scopes(parent.active_scope_) {
            parent.active_scope_ = act.heap().make<scope>(act, prev);
        }